

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O2

plain_range_sorted<CLocalizationDatabase::CString>
find_binary<plain_range_sorted<CLocalizationDatabase::CString>,CLocalizationDatabase::CString>
          (plain_range_sorted<CLocalizationDatabase::CString> range,CString value)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  CString value_00;
  int iVar5;
  CString *pCVar6;
  CString *in_RDX;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  plain_range<CLocalizationDatabase::CString> pVar8;
  undefined8 in_stack_ffffffffffffffa8;
  plain_range<CLocalizationDatabase::CString> in_stack_ffffffffffffffb0;
  plain_range<CLocalizationDatabase::CString> pVar9;
  CString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  CLocalizationDatabase::CString::CString(&local_40,in_RDX);
  value_00.m_Replacement = (string)in_stack_ffffffffffffffb0;
  value_00.m_Hash = (int)in_stack_ffffffffffffffa8;
  value_00.m_ContextHash = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  pVar8 = (plain_range<CLocalizationDatabase::CString>)
          partition_binary<plain_range_sorted<CLocalizationDatabase::CString>,CLocalizationDatabase::CString>
                    (range,value_00);
  pVar9 = pVar8;
  string_base<allocator_default<char>_>::~string_base(&local_40.m_Replacement);
  if (pVar8.begin < pVar8.end) {
    pVar8 = pVar9;
    pCVar6 = plain_range<CLocalizationDatabase::CString>::front
                       ((plain_range<CLocalizationDatabase::CString> *)&stack0xffffffffffffffb0);
    uVar1 = pCVar6->m_Hash;
    uVar3 = pCVar6->m_ContextHash;
    uVar2 = in_RDX->m_Hash;
    uVar4 = in_RDX->m_ContextHash;
    auVar7._4_4_ = -(uint)(uVar2 == uVar1);
    auVar7._0_4_ = -(uint)(uVar2 == uVar1);
    auVar7._8_4_ = -(uint)(uVar4 == uVar3);
    auVar7._12_4_ = -(uint)(uVar4 == uVar3);
    iVar5 = movmskpd((int)pCVar6,auVar7);
    if (iVar5 != 3) {
      pVar8 = (plain_range<CLocalizationDatabase::CString>)ZEXT816(0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return (plain_range_sorted<CLocalizationDatabase::CString>)pVar8;
}

Assistant:

R find_binary(R range, T value)
{
	range = partition_binary(range, value);
	if(range.empty()) return range;
	if(range.front() == value) return range;
	return R();
}